

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O0

void read_pnm_header(FILE *reader,pnm_header *ph)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  char *pcVar7;
  char **ppcStack_330;
  int allow_null;
  char *s;
  char line [256];
  char type [256];
  char idf [256];
  int ttype;
  int end;
  int format;
  pnm_header *ph_local;
  FILE *reader_local;
  
  pcVar7 = fgets((char *)&s,0xfa,(FILE *)reader);
  if (pcVar7 == (char *)0x0) {
    fprintf(_stderr,"\nWARNING: fgets return a NULL value");
  }
  else if ((char)s == 'P') {
    uVar5 = atoi((char *)((long)&s + 1));
    if ((0 < (int)uVar5) && ((int)uVar5 < 8)) {
      ph->format = uVar5;
      bVar3 = false;
      bVar4 = false;
LAB_0010ba4b:
      do {
        do {
          pcVar7 = fgets((char *)&s,0xfa,(FILE *)reader);
          if (pcVar7 == (char *)0x0) {
LAB_0010bee3:
            if (((uVar5 == 2) || (uVar5 == 3)) || (4 < (int)uVar5)) {
              if (ph->maxval < 1) {
                return;
              }
              if (0xffff < ph->maxval) {
                return;
              }
            }
            if (ph->width < 1) {
              return;
            }
            if (ph->height < 1) {
              return;
            }
            if (uVar5 != 7) {
              ph->ok = '\x01';
              if ((uVar5 != 1) && (uVar5 != 4)) {
                return;
              }
              ph->maxval = 0xff;
              return;
            }
            if (!bVar3) {
              fprintf(_stderr,"read_pnm_header:P7 without ENDHDR\n");
              return;
            }
            if (ph->depth < 1) {
              return;
            }
            if (4 < ph->depth) {
              return;
            }
            if (!bVar4) {
              return;
            }
            ph->ok = '\x01';
            return;
          }
          bVar2 = false;
        } while ((char)s == '#');
        ppcStack_330 = &s;
        if (uVar5 != 7) {
          if (ph->width == 0) {
            ppcStack_330 = (char **)skip_int((char *)ppcStack_330,&ph->width);
            if (ppcStack_330 == (char **)0x0) {
              return;
            }
            if (*(char *)ppcStack_330 == '\0') {
              return;
            }
            if (ph->width < 1) {
              return;
            }
            bVar2 = true;
          }
          if (ph->height == 0) {
            ppcStack_330 = (char **)skip_int((char *)ppcStack_330,&ph->height);
            if ((ppcStack_330 == (char **)0x0) && (bVar2)) goto LAB_0010ba4b;
            if (ppcStack_330 == (char **)0x0) {
              return;
            }
            if (*(char *)ppcStack_330 == '\0') {
              return;
            }
            if (ph->height < 1) {
              return;
            }
            if ((uVar5 == 1) || (uVar5 == 4)) goto LAB_0010bee3;
            bVar2 = true;
          }
          pcVar7 = skip_int((char *)ppcStack_330,&ph->maxval);
          if ((pcVar7 != (char *)0x0) || (!bVar2)) {
            if (pcVar7 == (char *)0x0) {
              return;
            }
            if (*pcVar7 == '\0') {
              return;
            }
            goto LAB_0010bee3;
          }
          goto LAB_0010ba4b;
        }
        pcVar7 = skip_idf((char *)ppcStack_330,type + 0xf8);
        if (pcVar7 == (char *)0x0) {
          return;
        }
        if (*pcVar7 == '\0') {
          return;
        }
        iVar6 = strcmp(type + 0xf8,"ENDHDR");
        if (iVar6 == 0) {
          bVar3 = true;
          goto LAB_0010bee3;
        }
        iVar6 = strcmp(type + 0xf8,"WIDTH");
        if (iVar6 == 0) {
          pcVar7 = skip_int(pcVar7,&ph->width);
          if (pcVar7 == (char *)0x0) {
            return;
          }
          cVar1 = *pcVar7;
        }
        else {
          iVar6 = strcmp(type + 0xf8,"HEIGHT");
          if (iVar6 == 0) {
            pcVar7 = skip_int(pcVar7,&ph->height);
            if (pcVar7 == (char *)0x0) {
              return;
            }
            cVar1 = *pcVar7;
          }
          else {
            iVar6 = strcmp(type + 0xf8,"DEPTH");
            if (iVar6 == 0) {
              pcVar7 = skip_int(pcVar7,&ph->depth);
              if (pcVar7 == (char *)0x0) {
                return;
              }
              cVar1 = *pcVar7;
            }
            else {
              iVar6 = strcmp(type + 0xf8,"MAXVAL");
              if (iVar6 != 0) {
                iVar6 = strcmp(type + 0xf8,"TUPLTYPE");
                if (iVar6 != 0) {
                  fprintf(_stderr,"read_pnm_header:unknown P7 idf %s\n",type + 0xf8);
                  return;
                }
                pcVar7 = skip_idf(pcVar7,line + 0xf8);
                if (pcVar7 == (char *)0x0) {
                  return;
                }
                if (*pcVar7 == '\0') {
                  return;
                }
                iVar6 = strcmp(line + 0xf8,"BLACKANDWHITE");
                if (iVar6 == 0) {
                  ph->bw = '\x01';
                  bVar4 = true;
                }
                else {
                  iVar6 = strcmp(line + 0xf8,"GRAYSCALE");
                  if (iVar6 == 0) {
                    ph->gray = '\x01';
                    bVar4 = true;
                  }
                  else {
                    iVar6 = strcmp(line + 0xf8,"GRAYSCALE_ALPHA");
                    if (iVar6 == 0) {
                      ph->graya = '\x01';
                      bVar4 = true;
                    }
                    else {
                      iVar6 = strcmp(line + 0xf8,"RGB");
                      if (iVar6 == 0) {
                        ph->rgb = '\x01';
                        bVar4 = true;
                      }
                      else {
                        iVar6 = strcmp(line + 0xf8,"RGB_ALPHA");
                        if (iVar6 != 0) {
                          fprintf(_stderr,"read_pnm_header:unknown P7 TUPLTYPE %s\n",line + 0xf8);
                          return;
                        }
                        ph->rgba = '\x01';
                        bVar4 = true;
                      }
                    }
                  }
                }
                goto LAB_0010ba4b;
              }
              pcVar7 = skip_int(pcVar7,&ph->maxval);
              if (pcVar7 == (char *)0x0) {
                return;
              }
              cVar1 = *pcVar7;
            }
          }
        }
        if (cVar1 == '\0') {
          return;
        }
      } while( true );
    }
    fprintf(_stderr,"read_pnm_header:magic format %d invalid\n",(ulong)uVar5);
  }
  else {
    fprintf(_stderr,"read_pnm_header:PNM:magic P missing\n");
  }
  return;
}

Assistant:

static void read_pnm_header(FILE *reader, struct pnm_header *ph)
{
    int format, end, ttype;
    char idf[256], type[256];
    char line[256];

    if (fgets(line, 250, reader) == NULL) {
        fprintf(stderr, "\nWARNING: fgets return a NULL value");
        return;
    }

    if (line[0] != 'P') {
        fprintf(stderr, "read_pnm_header:PNM:magic P missing\n");
        return;
    }
    format = atoi(line + 1);
    if (format < 1 || format > 7) {
        fprintf(stderr, "read_pnm_header:magic format %d invalid\n", format);
        return;
    }
    ph->format = format;
    ttype = end = 0;

    while (fgets(line, 250, reader)) {
        char *s;
        int allow_null = 0;

        if (*line == '#') {
            continue;
        }

        s = line;

        if (format == 7) {
            s = skip_idf(s, idf);

            if (s == NULL || *s == 0) {
                return;
            }

            if (strcmp(idf, "ENDHDR") == 0) {
                end = 1;
                break;
            }
            if (strcmp(idf, "WIDTH") == 0) {
                s = skip_int(s, &ph->width);
                if (s == NULL || *s == 0) {
                    return;
                }

                continue;
            }
            if (strcmp(idf, "HEIGHT") == 0) {
                s = skip_int(s, &ph->height);
                if (s == NULL || *s == 0) {
                    return;
                }

                continue;
            }
            if (strcmp(idf, "DEPTH") == 0) {
                s = skip_int(s, &ph->depth);
                if (s == NULL || *s == 0) {
                    return;
                }

                continue;
            }
            if (strcmp(idf, "MAXVAL") == 0) {
                s = skip_int(s, &ph->maxval);
                if (s == NULL || *s == 0) {
                    return;
                }

                continue;
            }
            if (strcmp(idf, "TUPLTYPE") == 0) {
                s = skip_idf(s, type);
                if (s == NULL || *s == 0) {
                    return;
                }

                if (strcmp(type, "BLACKANDWHITE") == 0) {
                    ph->bw = 1;
                    ttype = 1;
                    continue;
                }
                if (strcmp(type, "GRAYSCALE") == 0) {
                    ph->gray = 1;
                    ttype = 1;
                    continue;
                }
                if (strcmp(type, "GRAYSCALE_ALPHA") == 0) {
                    ph->graya = 1;
                    ttype = 1;
                    continue;
                }
                if (strcmp(type, "RGB") == 0) {
                    ph->rgb = 1;
                    ttype = 1;
                    continue;
                }
                if (strcmp(type, "RGB_ALPHA") == 0) {
                    ph->rgba = 1;
                    ttype = 1;
                    continue;
                }
                fprintf(stderr, "read_pnm_header:unknown P7 TUPLTYPE %s\n", type);
                return;
            }
            fprintf(stderr, "read_pnm_header:unknown P7 idf %s\n", idf);
            return;
        } /* if(format == 7) */

        /* Here format is in range [1,6] */
        if (ph->width == 0) {
            s = skip_int(s, &ph->width);
            if ((s == NULL) || (*s == 0) || (ph->width < 1)) {
                return;
            }
            allow_null = 1;
        }
        if (ph->height == 0) {
            s = skip_int(s, &ph->height);
            if ((s == NULL) && allow_null) {
                continue;
            }
            if ((s == NULL) || (*s == 0) || (ph->height < 1)) {
                return;
            }
            if (format == 1 || format == 4) {
                break;
            }
            allow_null = 1;
        }
        /* here, format is in P2, P3, P5, P6 */
        s = skip_int(s, &ph->maxval);
        if ((s == NULL) && allow_null) {
            continue;
        }
        if ((s == NULL) || (*s == 0)) {
            return;
        }
        break;
    }/* while(fgets( ) */
    if (format == 2 || format == 3 || format > 4) {
        if (ph->maxval < 1 || ph->maxval > 65535) {
            return;
        }
    }
    if (ph->width < 1 || ph->height < 1) {
        return;
    }

    if (format == 7) {
        if (!end) {
            fprintf(stderr, "read_pnm_header:P7 without ENDHDR\n");
            return;
        }
        if (ph->depth < 1 || ph->depth > 4) {
            return;
        }

        if (ttype) {
            ph->ok = 1;
        }
    } else {
        ph->ok = 1;
        if (format == 1 || format == 4) {
            ph->maxval = 255;
        }
    }
}